

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table_test.cc
# Opt level: O0

Status __thiscall
leveldb::StringSource::Read(StringSource *this,uint64_t offset,size_t n,Slice *result,char *scratch)

{
  char *__dest;
  ulong uVar1;
  ulong uVar2;
  long lVar3;
  void *__src;
  char *in_R9;
  Slice local_68;
  Slice local_58;
  Slice local_48;
  char *local_38;
  char *scratch_local;
  Slice *result_local;
  size_t n_local;
  uint64_t offset_local;
  StringSource *this_local;
  
  local_38 = in_R9;
  scratch_local = scratch;
  result_local = result;
  n_local = n;
  offset_local = offset;
  this_local = this;
  uVar1 = std::__cxx11::string::size();
  if (n < uVar1) {
    uVar1 = (long)&result_local->data_ + n_local;
    uVar2 = std::__cxx11::string::size();
    if (uVar2 < uVar1) {
      lVar3 = std::__cxx11::string::size();
      result_local = (Slice *)(lVar3 - n_local);
    }
    __dest = local_38;
    __src = (void *)std::__cxx11::string::operator[](offset + 8);
    memcpy(__dest,__src,(size_t)result_local);
    Slice::Slice(&local_68,local_38,(size_t)result_local);
    *(char **)scratch_local = local_68.data_;
    *(size_t *)(scratch_local + 8) = local_68.size_;
    Status::OK();
  }
  else {
    Slice::Slice(&local_48,"invalid Read offset");
    Slice::Slice(&local_58);
    Status::InvalidArgument((Status *)this,&local_48,&local_58);
  }
  return (Status)(char *)this;
}

Assistant:

Status Read(uint64_t offset, size_t n, Slice* result,
              char* scratch) const override {
    if (offset >= contents_.size()) {
      return Status::InvalidArgument("invalid Read offset");
    }
    if (offset + n > contents_.size()) {
      n = contents_.size() - offset;
    }
    std::memcpy(scratch, &contents_[offset], n);
    *result = Slice(scratch, n);
    return Status::OK();
  }